

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O0

void __thiscall
OpenMD::BOPofR::BOPofR
          (BOPofR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  key_type *pkVar5;
  mapped_type *pmVar6;
  mapped_type *__x;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar7;
  undefined8 in_XMM1_Qa;
  int mmm;
  int ii;
  pair<int,_int> lm;
  int m1;
  int l;
  int mSize;
  int error;
  RealType m2M;
  RealType m2m;
  RealType m1Pass;
  RealType lPass;
  RealType *THRCOF;
  uint i;
  string paramString;
  stringstream params;
  undefined4 in_stack_fffffffffffffc68;
  uint in_stack_fffffffffffffc6c;
  StaticAnalyser *in_stack_fffffffffffffc70;
  SimInfo *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  size_type in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  allocator<char> *in_stack_fffffffffffffca0;
  SelectionEvaluator *in_stack_fffffffffffffca8;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  SelectionEvaluator *in_stack_fffffffffffffcc0;
  int local_2c0;
  int local_2bc;
  int local_2b0;
  int local_2ac;
  double local_2a0;
  SimInfo *in_stack_fffffffffffffd68;
  SelectionEvaluator *in_stack_fffffffffffffd70;
  uint local_274;
  string local_270 [32];
  stringstream local_250 [16];
  ostream local_240 [32];
  int *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdec;
  RealType *in_stack_fffffffffffffdf0;
  RealType *in_stack_fffffffffffffdf8;
  RealType *in_stack_fffffffffffffe00;
  RealType in_stack_fffffffffffffe08;
  RealType in_stack_fffffffffffffe10;
  RealType in_stack_fffffffffffffe18;
  RealType in_stack_fffffffffffffe20;
  SimInfo *in_stack_ffffffffffffff18;
  SelectionManager *in_stack_ffffffffffffff20;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  undefined8 local_38;
  undefined8 local_28;
  string *local_20;
  
  local_38 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc78,(string *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
            );
  *in_RDI = &PTR__BOPofR_0055e838;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),local_20);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x145ea5);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x145ec1);
  std::
  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::map((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
         *)0x145edd);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x145ef9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x145f15);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x145f31);
  getPrefix((string *)in_stack_fffffffffffffc78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffc70,
             (string *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  StaticAnalyser::setAnalysisType
            (in_stack_fffffffffffffc70,
             (string *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffca8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (SelectionSet *)in_stack_fffffffffffffc78);
    SelectionSet::~SelectionSet((SelectionSet *)0x14608e);
  }
  in_RDI[0xe1] = local_28;
  in_RDI[0xe3] = local_38;
  std::__cxx11::stringstream::stringstream(local_250);
  poVar3 = std::operator<<(local_240," rcut = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)in_RDI[0xe1]);
  poVar3 = std::operator<<(poVar3,", len = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)in_RDI[0xe3]);
  poVar3 = std::operator<<(poVar3,", nbins = ");
  std::ostream::operator<<(poVar3,*(uint *)((long)in_RDI + 0x34));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (in_stack_fffffffffffffc70,
             (string *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  in_RDI[0xe4] = (double)in_RDI[0xe3] / (double)*(uint *)((long)in_RDI + 0x34);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88
            );
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88
            );
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88
            );
  for (local_274 = 0; local_274 < *(uint *)((long)in_RDI + 0x34); local_274 = local_274 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf7),(ulong)local_274);
    *pvVar4 = 0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xfa),(ulong)local_274);
    *pvVar4 = 0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xfd),(ulong)local_274);
    *pvVar4 = 0;
  }
  pkVar5 = (key_type *)operator_new__(0x68);
  __k = pkVar5;
  for (local_2ac = 0; local_2ac < 7; local_2ac = local_2ac + 1) {
    for (local_2b0 = -local_2ac; local_2b0 <= local_2ac; local_2b0 = local_2b0 + 1) {
      std::make_pair<int&,int&>
                ((int *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (int *)0x1464b0);
      for (local_2bc = 0; local_2bc < local_2ac * 2 + 1; local_2bc = local_2bc + 1) {
        pkVar5[local_2bc].first = 0;
        pkVar5[local_2bc].second = 0;
      }
      MATPACK::Wigner3jm(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                         in_stack_fffffffffffffde0);
      dVar7 = floor((double)in_stack_fffffffffffffd68);
      iVar2 = (int)dVar7;
      pmVar6 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                             *)poVar3,__k);
      *pmVar6 = iVar2;
      dVar7 = floor(local_2a0);
      iVar2 = (int)dVar7;
      pmVar6 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                             *)poVar3,__k);
      *pmVar6 = iVar2;
      for (local_2c0 = 0; local_2c0 <= (int)(local_2a0 - (double)in_stack_fffffffffffffd68);
          local_2c0 = local_2c0 + 1) {
        __x = std::
              map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                            *)poVar3,__k);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffc80),(value_type_conflict2 *)__x);
      }
    }
  }
  if (pkVar5 != (key_type *)0x0) {
    operator_delete__(pkVar5);
  }
  std::__cxx11::string::~string(local_270);
  std::__cxx11::stringstream::~stringstream(local_250);
  return;
}

Assistant:

BOPofR::BOPofR(SimInfo* info, const std::string& filename,
                 const std::string& sele, double rCut, unsigned int nbins,
                 RealType len) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setOutputName(getPrefix(filename) + ".bo");
    setAnalysisType("Bond Order Parameter(r)");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_ = rCut;
    len_  = len;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", len = " << len_
           << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    deltaR_ = len_ / nBins_;
    RCount_.resize(nBins_);
    WofR_.resize(nBins_);
    QofR_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }

    delete[] THRCOF;
    THRCOF = NULL;
  }